

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_memory_t * wasm_memory_new(wasm_store_t *store,wasm_memorytype_t *type)

{
  ExternType *pEVar1;
  wasm_memory_t *this;
  RefPtr<wabt::interp::Memory> local_58;
  undefined1 local_40 [40];
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_memory_new");
  this = (wasm_memory_t *)operator_new(0x18);
  pEVar1 = (type->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if (pEVar1->kind == Memory) {
    local_40._8_4_ = Memory;
    local_40._0_8_ = &PTR__ExternType_001e4920;
    local_40._16_8_ = pEVar1[1]._vptr_ExternType;
    local_40._24_8_ = *(undefined8 *)&pEVar1[1].kind;
    local_40._32_8_ = pEVar1[2]._vptr_ExternType;
    wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
              (&local_58,&store->I,&store->I,(MemoryType *)local_40);
    wasm_memory_t::wasm_memory_t(this,&local_58);
    if (local_58.obj_ != (Memory *)0x0) {
      wabt::interp::Store::DeleteRoot(local_58.store_,local_58.root_index_);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::MemoryType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_memory_t* wasm_memory_new(wasm_store_t* store,
                                   const wasm_memorytype_t* type) {
  TRACE0();
  return new wasm_memory_t{Memory::New(store->I, *type->As<MemoryType>())};
}